

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O2

void __thiscall antlr::ASTFactory::~ASTFactory(ASTFactory *this)

{
  pointer pppVar1;
  
  this->_vptr_ASTFactory = (_func_int **)&PTR__ASTFactory_001fea48;
  for (pppVar1 = (this->nodeFactories).
                 super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pppVar1 !=
      (this->nodeFactories).
      super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; pppVar1 = pppVar1 + 1) {
    if (*pppVar1 != &this->default_factory_descriptor) {
      operator_delete(*pppVar1,0x10);
    }
  }
  std::
  _Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
  ::~_Vector_base(&(this->nodeFactories).
                   super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
                 );
  return;
}

Assistant:

ASTFactory::~ASTFactory()
{
	factory_descriptor_list::iterator i = nodeFactories.begin();

	while( i != nodeFactories.end() )
	{
		if( *i != &default_factory_descriptor )
			delete *i;
		++i;
	}
}